

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_count(archive_acl *acl,wchar_t want_type)

{
  archive_acl_entry *ap;
  wchar_t count;
  wchar_t want_type_local;
  archive_acl *acl_local;
  
  count = L'\0';
  for (ap = acl->acl_head; ap != (archive_acl_entry *)0x0; ap = ap->next) {
    if ((ap->type & want_type) != 0) {
      count = count + L'\x01';
    }
  }
  if ((L'\0' < count) && ((want_type & 0x100U) != 0)) {
    count = count + L'\x03';
  }
  return count;
}

Assistant:

int
archive_acl_count(struct archive_acl *acl, int want_type)
{
	int count;
	struct archive_acl_entry *ap;

	count = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & want_type) != 0)
			count++;
		ap = ap->next;
	}

	if (count > 0 && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0))
		count += 3;
	return (count);
}